

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O0

bool google::protobuf::internal::anon_unknown_36::IsFieldEligibleForFastParsing
               (FieldEntryInfo *entry,FieldOptions *options,MessageOptions *message_options)

{
  float fVar1;
  bool bVar2;
  byte bVar3;
  Type TVar4;
  LogMessage *pLVar5;
  LogMessage local_48;
  Voidify local_35;
  float local_34;
  FieldDescriptor *pFStack_30;
  int aux_idx;
  FieldDescriptor *field;
  MessageOptions *message_options_local;
  FieldOptions *options_local;
  FieldEntryInfo *entry_local;
  
  pFStack_30 = entry->field;
  field = (FieldDescriptor *)message_options;
  message_options_local = (MessageOptions *)options;
  options_local = (FieldOptions *)entry;
  bVar2 = IsFieldTypeEligibleForFastParsing(pFStack_30);
  if (((bVar2) && ((message_options_local[9].uses_codegen & 1U) == 0)) &&
     ((message_options_local[10].uses_codegen & 1U) == 0)) {
    bVar2 = HasLazyRep(pFStack_30,(FieldOptions *)message_options_local);
    if ((bVar2) && ((field->field_0x1 & 1) == 0)) {
      entry_local._7_1_ = false;
    }
    else {
      bVar2 = HasLazyRep(pFStack_30,(FieldOptions *)message_options_local);
      if ((bVar2) && (message_options_local[8] == (MessageOptions)0x400)) {
        entry_local._7_1_ = false;
      }
      else {
        local_34 = (float)(uint)options_local->lazy_opt;
        TVar4 = FieldDescriptor::type(pFStack_30);
        if (((TVar4 == TYPE_STRING) || (TVar4 == TYPE_BYTES)) &&
           ((message_options_local[9].is_lite & 1U) != 0)) {
          bVar2 = FieldDescriptor::is_repeated(pFStack_30);
          if (bVar2) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_48,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                       ,0x124,"!field->is_repeated()");
            pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_35,pLVar5);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_48);
          }
          local_34 = options_local->presence_probability;
        }
        fVar1 = local_34;
        if (options_local->has_bit_index < 0x20) {
          bVar3 = std::numeric_limits<unsigned_char>::max();
          if ((int)(uint)bVar3 < (int)fVar1) {
            entry_local._7_1_ = false;
          }
          else {
            entry_local._7_1_ = true;
          }
        }
        else {
          entry_local._7_1_ = false;
        }
      }
    }
  }
  else {
    entry_local._7_1_ = false;
  }
  return entry_local._7_1_;
}

Assistant:

bool IsFieldEligibleForFastParsing(
    const TailCallTableInfo::FieldEntryInfo& entry,
    const TailCallTableInfo::FieldOptions& options,
    const TailCallTableInfo::MessageOptions& message_options) {
  const auto* field = entry.field;
  // Map, oneof, weak, and split fields are not handled on the fast path.
  if (!IsFieldTypeEligibleForFastParsing(field) || options.is_implicitly_weak ||
      options.should_split) {
    return false;
  }

  if (HasLazyRep(field, options) && !message_options.uses_codegen) {
    // Can't use TDP on lazy fields if we can't do codegen.
    return false;
  }

  if (HasLazyRep(field, options) && options.lazy_opt == field_layout::kTvLazy) {
    // We only support eagerly verified lazy fields in the fast path.
    return false;
  }

  // We will check for a valid auxiliary index range later. However, we might
  // want to change the value we check for inlined string fields.
  int aux_idx = entry.aux_idx;

  switch (field->type()) {
      // Some bytes fields can be handled on fast path.
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: {
      if (options.is_string_inlined) {
        ABSL_CHECK(!field->is_repeated());
        // For inlined strings, the donation state index is stored in the
        // `aux_idx` field of the fast parsing info. We need to check the range
        // of that value instead of the auxiliary index.
        aux_idx = entry.inlined_string_idx;
      }
      break;
    }

    default:
      break;
  }

  if (entry.hasbit_idx > TailCallTableInfo::kMaxFastFieldHasbitIndex)
    return false;

  // If the field needs auxiliary data, then the aux index is needed. This
  // must fit in a uint8_t.
  if (aux_idx > std::numeric_limits<uint8_t>::max()) {
    return false;
  }

  return true;
}